

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase458::run(TestCase458 *this)

{
  Reader reader_00;
  size_t sVar1;
  size_t sVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_t extraout_RDX;
  ArrayPtr<const_unsigned_char> packedBytes;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments;
  ArrayPtr<const_unsigned_char> packedBytes_00;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar4;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar5;
  ReaderOptions options;
  TestPipe pipe;
  PackedMessageReader reader;
  TestMessageBuilder builder;
  undefined1 local_308 [32];
  undefined1 local_2e8 [8];
  OutputStream OStack_2e0;
  void *local_2d8;
  _Alloc_hider local_2d0;
  uchar *local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  size_type local_2b0;
  StructBuilder local_2a8;
  StructReader local_278;
  PackedMessageReader local_248;
  TestMessageBuilder local_108;
  size_t extraout_RDX_00;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_108.super_MallocMessageBuilder,0,FIXED_SIZE);
  local_108.super_MallocMessageBuilder.super_MessageBuilder._vptr_MessageBuilder =
       (_func_int **)&PTR__TestMessageBuilder_00374a38;
  local_108.desiredSegmentCount = 2;
  MessageBuilder::getRootInternal((Builder *)local_308,(MessageBuilder *)&local_108);
  local_2a8.data = (void *)local_308._16_8_;
  local_2a8.segment = (SegmentBuilder *)local_308._0_8_;
  local_2a8.capTable = (CapTableBuilder *)local_308._8_8_;
  PointerBuilder::initStruct
            ((StructBuilder *)local_2e8,(PointerBuilder *)&local_2a8,(StructSize)0x140006);
  local_2a8.data = local_2d0._M_p + 0x10;
  local_2a8.segment = (SegmentBuilder *)local_2e8;
  local_2a8.capTable = (CapTableBuilder *)OStack_2e0._vptr_OutputStream;
  PointerBuilder::initStruct
            ((StructBuilder *)&local_248,(PointerBuilder *)&local_2a8,(StructSize)0x140006);
  local_308._16_8_ =
       local_248.super_InputStreamMessageReader.super_MessageReader.options.traversalLimitInWords +
       0x10;
  local_308._0_8_ = local_248.super_PackedInputStream.super_InputStream._vptr_InputStream;
  local_308._8_8_ = local_248.super_PackedInputStream.inner;
  PointerBuilder::initStruct(&local_2a8,(PointerBuilder *)local_308,(StructSize)0x140006);
  paVar3 = &local_2c0;
  local_2e8 = (undefined1  [8])&PTR__TestPipe_00374960;
  OStack_2e0._vptr_OutputStream = (_func_int **)&PTR__TestPipe_003749a0;
  local_2d8 = (void *)0x1;
  local_2c8 = (uchar *)0x0;
  local_2c0._M_local_buf[0] = '\0';
  local_2b0 = 0;
  local_2d0._M_p = (pointer)paVar3;
  AVar4 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&local_108);
  AVar5.ptr = (ArrayPtr<const_capnp::word> *)AVar4.size_;
  AVar5.size_ = (size_t)paVar3;
  writePackedMessage((capnp *)&OStack_2e0,(OutputStream *)AVar4.ptr,AVar5);
  AVar5 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&local_108);
  AVar4.size_ = (ArrayPtr<const_capnp::word> *)AVar5.size_;
  AVar4.ptr = AVar4.size_;
  sVar1 = computeSerializedSizeInWords((capnp *)AVar5.ptr,AVar4);
  packedBytes.size_ = extraout_RDX;
  packedBytes.ptr = local_2c8;
  sVar2 = computeUnpackedSizeInWords((capnp *)local_2d0._M_p,packedBytes);
  if ((sVar1 != sVar2) && (kj::_::Debug::minSeverity < 3)) {
    AVar4 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&local_108);
    segments.size_ = (ArrayPtr<const_capnp::word> *)AVar4.size_;
    segments.ptr = segments.size_;
    local_248.super_PackedInputStream.super_InputStream._vptr_InputStream =
         (_func_int **)computeSerializedSizeInWords((capnp *)AVar4.ptr,segments);
    packedBytes_00.size_ = extraout_RDX_00;
    packedBytes_00.ptr = local_2c8;
    local_2a8.segment =
         (SegmentBuilder *)computeUnpackedSizeInWords((capnp *)local_2d0._M_p,packedBytes_00);
    kj::_::Debug::log<char_const(&)[106],unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed-test.c++"
               ,0x1d1,ERROR,
               "\"failed: expected \" \"(computeSerializedSizeInWords(builder)) == (computeUnpackedSizeInWords(pipe.getArray()))\", computeSerializedSizeInWords(builder), computeUnpackedSizeInWords(pipe.getArray())"
               ,(char (*) [106])
                "failed: expected (computeSerializedSizeInWords(builder)) == (computeUnpackedSizeInWords(pipe.getArray()))"
               ,(unsigned_long *)&local_248,(unsigned_long *)&local_2a8);
  }
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  PackedMessageReader::PackedMessageReader
            (&local_248,(BufferedInputStream *)local_2e8,options,(ArrayPtr<capnp::word>)ZEXT816(0));
  MessageReader::getRootInternal
            ((Reader *)local_308,&local_248.super_InputStreamMessageReader.super_MessageReader);
  local_2a8.data = (void *)local_308._16_8_;
  local_2a8.pointers = (WirePointer *)local_308._24_8_;
  local_2a8.segment = (SegmentBuilder *)local_308._0_8_;
  local_2a8.capTable = (CapTableBuilder *)local_308._8_8_;
  PointerReader::getStruct(&local_278,(PointerReader *)&local_2a8,(word *)0x0);
  reader_00._reader.capTable = local_278.capTable;
  reader_00._reader.segment = local_278.segment;
  reader_00._reader.data = local_278.data;
  reader_00._reader.pointers = local_278.pointers;
  reader_00._reader.dataSize = local_278.dataSize;
  reader_00._reader.pointerCount = local_278.pointerCount;
  reader_00._reader._38_2_ = local_278._38_2_;
  reader_00._reader.nestingLimit = local_278.nestingLimit;
  reader_00._reader._44_4_ = local_278._44_4_;
  checkTestMessageAllZero(reader_00);
  PackedMessageReader::~PackedMessageReader(&local_248);
  TestPipe::~TestPipe((TestPipe *)local_2e8);
  TestMessageBuilder::~TestMessageBuilder(&local_108);
  return;
}

Assistant:

TEST(Packed, RoundTripAllZeroEvenSegmentCountLazy) {
  TestMessageBuilder builder(2);
  builder.initRoot<TestAllTypes>().initStructField().initStructField();

  TestPipe pipe(1);
  writePackedMessage(pipe, builder);

  EXPECT_EQ(computeSerializedSizeInWords(builder), computeUnpackedSizeInWords(pipe.getArray()));

  PackedMessageReader reader(pipe);
  checkTestMessageAllZero(reader.getRoot<TestAllTypes>());
}